

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  __m256i vWH_00;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  uint uVar43;
  int iVar44;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar45;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  int iVar46;
  undefined1 auVar48 [16];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  long in_stack_00000008;
  int32_t value;
  __m256i cond_all;
  __m256i cond_valid_J;
  __m256i cond_valid_I;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vIBoundary;
  __m256i vJLimit1;
  __m256i vJLimit;
  __m256i vILimit1;
  __m256i vILimit;
  __m256i vMax;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vGapN;
  __m256i vN;
  __m256i vOne;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int in_stack_ffffffffffffedc8;
  int32_t j_00;
  long lVar53;
  undefined4 in_stack_ffffffffffffedd8;
  int iVar54;
  int in_stack_ffffffffffffede0;
  int32_t iVar55;
  long lVar56;
  undefined4 in_stack_ffffffffffffedf0;
  int iVar57;
  int local_1208;
  int local_1204;
  int *array;
  int local_11f0;
  int local_11ec;
  int local_11d8;
  int local_11d4;
  int local_11c0;
  int local_11bc;
  int local_11a8;
  int local_11a4;
  int local_1190;
  int local_118c;
  int local_114c;
  uint local_1148;
  undefined1 local_1040 [32];
  undefined1 local_1020 [24];
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [24];
  undefined8 uStack_fc8;
  undefined1 local_fc0 [24];
  undefined8 uStack_fa8;
  undefined1 local_fa0 [32];
  undefined1 local_f00 [32];
  undefined1 local_ec0 [32];
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  uint local_d34;
  int local_d28;
  int local_d24;
  uint local_d20;
  uint local_d1c;
  int32_t *local_ce0;
  parasail_result_t *local_c98;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  
  local_ce0 = (int32_t *)0x0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_avx2_256_32","_s2");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_avx2_256_32","s2Len");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_avx2_256_32","open");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_avx2_256_32","gap");
    local_c98 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_avx2_256_32","matrix");
    local_c98 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_avx2_256_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if ((int)in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_avx2_256_32","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_1148 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_1148 = *(uint *)(in_stack_00000008 + 0x34);
    }
    local_d24 = local_1148 - 1;
    local_d28 = in_ECX - 1;
    if ((int)-in_R8D < *(int *)(in_stack_00000008 + 0x20)) {
      local_114c = in_R8D + 0x80000000;
    }
    else {
      local_114c = -0x80000000 - *(int *)(in_stack_00000008 + 0x20);
    }
    local_d34 = local_114c + 1;
    uVar43 = 0x7ffffffe - *(int *)(in_stack_00000008 + 0x1c);
    auVar14 = vpinsrd_avx(ZEXT416(local_d34),local_d34,1);
    auVar14 = vpinsrd_avx(auVar14,local_d34,2);
    auVar14 = vpinsrd_avx(auVar14,local_d34,3);
    auVar15 = vpinsrd_avx(ZEXT416(local_d34),local_d34,1);
    auVar15 = vpinsrd_avx(auVar15,local_d34,2);
    auVar15 = vpinsrd_avx(auVar15,local_d34,3);
    uStack_c50 = auVar15._0_8_;
    uStack_c48 = auVar15._8_8_;
    auVar15 = vpinsrd_avx(ZEXT416(uVar43),uVar43,1);
    auVar15 = vpinsrd_avx(auVar15,uVar43,2);
    auVar15 = vpinsrd_avx(auVar15,uVar43,3);
    auVar16 = vpinsrd_avx(ZEXT416(uVar43),uVar43,1);
    auVar16 = vpinsrd_avx(auVar16,uVar43,2);
    auVar16 = vpinsrd_avx(auVar16,uVar43,3);
    uStack_c10 = auVar16._0_8_;
    uStack_c08 = auVar16._8_8_;
    local_da0._16_8_ = uStack_c10;
    local_da0._0_16_ = auVar15;
    local_da0._24_8_ = uStack_c08;
    local_dc0._16_8_ = uStack_c50;
    local_dc0._0_16_ = auVar14;
    local_dc0._24_8_ = uStack_c48;
    auVar16 = vpinsrd_avx(ZEXT416(local_d34),local_d34,1);
    auVar16 = vpinsrd_avx(auVar16,local_d34,2);
    auVar16 = vpinsrd_avx(auVar16,local_d34,3);
    auVar17 = vpinsrd_avx(ZEXT416(local_d34),local_d34,1);
    auVar17 = vpinsrd_avx(auVar17,local_d34,2);
    auVar17 = vpinsrd_avx(auVar17,local_d34,3);
    uStack_bd0 = auVar17._0_8_;
    uStack_bc8 = auVar17._8_8_;
    auVar17 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar17 = vpinsrd_avx(auVar17,in_R8D,2);
    auVar17 = vpinsrd_avx(auVar17,in_R8D,3);
    auVar18 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar18 = vpinsrd_avx(auVar18,in_R8D,2);
    auVar18 = vpinsrd_avx(auVar18,in_R8D,3);
    uStack_b90 = auVar18._0_8_;
    uStack_b88 = auVar18._8_8_;
    auVar18 = vpinsrd_avx(ZEXT416(in_R9D),in_R9D,1);
    auVar18 = vpinsrd_avx(auVar18,in_R9D,2);
    auVar18 = vpinsrd_avx(auVar18,in_R9D,3);
    auVar19 = vpinsrd_avx(ZEXT416(in_R9D),in_R9D,1);
    auVar19 = vpinsrd_avx(auVar19,in_R9D,2);
    auVar19 = vpinsrd_avx(auVar19,in_R9D,3);
    uStack_b50 = auVar19._0_8_;
    uStack_b48 = auVar19._8_8_;
    auVar19 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar19 = vpinsrd_avx(auVar19,1,2);
    auVar19 = vpinsrd_avx(auVar19,1,3);
    auVar20 = vpinsrd_avx(ZEXT416(1),1,1);
    auVar20 = vpinsrd_avx(auVar20,1,2);
    auVar20 = vpinsrd_avx(auVar20,1,3);
    uStack_b10 = auVar20._0_8_;
    uStack_b08 = auVar20._8_8_;
    auVar20 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar20 = vpinsrd_avx(auVar20,8,2);
    auVar20 = vpinsrd_avx(auVar20,8,3);
    auVar21 = vpinsrd_avx(ZEXT416(8),8,1);
    auVar21 = vpinsrd_avx(auVar21,8,2);
    auVar21 = vpinsrd_avx(auVar21,8,3);
    uStack_ad0 = auVar21._0_8_;
    uStack_ac8 = auVar21._8_8_;
    uVar43 = in_R9D * 8;
    auVar21 = vpinsrd_avx(ZEXT416(uVar43),uVar43,1);
    auVar21 = vpinsrd_avx(auVar21,uVar43,2);
    auVar21 = vpinsrd_avx(auVar21,uVar43,3);
    auVar22 = vpinsrd_avx(ZEXT416(uVar43),uVar43,1);
    auVar22 = vpinsrd_avx(auVar22,uVar43,2);
    auVar22 = vpinsrd_avx(auVar22,uVar43,3);
    uStack_a90 = auVar22._0_8_;
    uStack_a88 = auVar22._8_8_;
    auVar22 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
    auVar22 = vpinsrd_avx(auVar22,0xffffffff,2);
    auVar22 = vpinsrd_avx(auVar22,0xffffffff,3);
    auVar23 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
    auVar23 = vpinsrd_avx(auVar23,0xffffffff,2);
    auVar23 = vpinsrd_avx(auVar23,0xffffffff,3);
    uStack_a50 = auVar23._0_8_;
    uStack_a48 = auVar23._8_8_;
    auVar23 = vpinsrd_avx(ZEXT416(7),6,1);
    auVar23 = vpinsrd_avx(auVar23,5,2);
    local_ec0._0_16_ = vpinsrd_avx(auVar23,4,3);
    auVar23 = vpinsrd_avx(ZEXT416(3),2,1);
    auVar23 = vpinsrd_avx(auVar23,1,2);
    auVar23 = vpinsrd_avx(auVar23,0,3);
    uStack_8d0 = auVar23._0_8_;
    uStack_8c8 = auVar23._8_8_;
    local_ec0._16_8_ = uStack_8d0;
    local_ec0._24_8_ = uStack_8c8;
    auVar23 = vpinsrd_avx(ZEXT416(0xfffffff9),0xfffffffa,1);
    auVar23 = vpinsrd_avx(auVar23,0xfffffffb,2);
    auVar23 = vpinsrd_avx(auVar23,0xfffffffc,3);
    auVar24 = vpinsrd_avx(ZEXT416(0xfffffffd),0xfffffffe,1);
    auVar24 = vpinsrd_avx(auVar24,0xffffffff,2);
    auVar24 = vpinsrd_avx(auVar24,0,3);
    uStack_910 = auVar24._0_8_;
    uStack_908 = auVar24._8_8_;
    local_f00._16_8_ = uStack_bd0;
    local_f00._0_16_ = auVar16;
    local_f00._24_8_ = uStack_bc8;
    auVar24 = vpinsrd_avx(ZEXT416(local_1148),local_1148,1);
    auVar24 = vpinsrd_avx(auVar24,local_1148,2);
    auVar24 = vpinsrd_avx(auVar24,local_1148,3);
    auVar25 = vpinsrd_avx(ZEXT416(local_1148),local_1148,1);
    auVar25 = vpinsrd_avx(auVar25,local_1148,2);
    auVar25 = vpinsrd_avx(auVar25,local_1148,3);
    uStack_a10 = auVar25._0_8_;
    uStack_a08 = auVar25._8_8_;
    auVar49._16_8_ = uStack_a10;
    auVar49._0_16_ = auVar24;
    auVar49._24_8_ = uStack_a08;
    auVar26._16_8_ = uStack_b10;
    auVar26._0_16_ = auVar19;
    auVar26._24_8_ = uStack_b08;
    auVar26 = vpsubd_avx2(auVar49,auVar26);
    auVar24 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar24 = vpinsrd_avx(auVar24,in_ECX,2);
    auVar24 = vpinsrd_avx(auVar24,in_ECX,3);
    auVar25 = vpinsrd_avx(ZEXT416(in_ECX),in_ECX,1);
    auVar25 = vpinsrd_avx(auVar25,in_ECX,2);
    auVar25 = vpinsrd_avx(auVar25,in_ECX,3);
    uStack_9d0 = auVar25._0_8_;
    uStack_9c8 = auVar25._8_8_;
    auVar47._16_8_ = uStack_9d0;
    auVar47._0_16_ = auVar24;
    auVar47._24_8_ = uStack_9c8;
    auVar27._16_8_ = uStack_b10;
    auVar27._0_16_ = auVar19;
    auVar27._24_8_ = uStack_b08;
    auVar27 = vpsubd_avx2(auVar47,auVar27);
    iVar46 = -in_R8D;
    auVar24 = vpinsrd_avx(ZEXT416(iVar46 + in_R9D * -3),iVar46 + in_R9D * -2,1);
    auVar24 = vpinsrd_avx(auVar24,iVar46 - in_R9D,2);
    auVar24 = vpinsrd_avx(auVar24,iVar46,3);
    auVar25 = vpinsrd_avx(ZEXT416(in_R9D * -7 - in_R8D),iVar46 + in_R9D * -6,1);
    auVar25 = vpinsrd_avx(auVar25,iVar46 + in_R9D * -5,2);
    auVar25 = vpinsrd_avx(auVar25,iVar46 + in_R9D * -4,3);
    auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
    uStack_950 = auVar48._0_8_;
    uStack_948 = auVar48._8_8_;
    local_fa0._16_8_ = uStack_950;
    local_fa0._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar25;
    local_fa0._24_8_ = uStack_948;
    auVar52 = ZEXT1664(auVar24);
    local_c98 = parasail_result_new_table1(local_1148,in_ECX);
    if (local_c98 == (parasail_result_t *)0x0) {
      local_c98 = (parasail_result_t *)0x0;
    }
    else {
      local_c98->flag = local_c98->flag | 0x8401001;
      local_c98->flag = local_c98->flag | 0x20000;
      ptr = parasail_memalign_int32_t(0x20,(long)(int)(in_ECX + 0xe));
      ptr_00 = parasail_memalign_int32_t(0x20,(long)(int)(in_ECX + 0xe));
      ptr_01 = parasail_memalign_int32_t(0x20,(long)(int)(in_ECX + 0xe));
      if (ptr == (int32_t *)0x0) {
        local_c98 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        local_c98 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (int32_t *)0x0) {
        local_c98 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_ce0 = parasail_memalign_int32_t(0x20,(long)(int)(local_1148 + 7));
          if (local_ce0 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_d1c = 0; (int)local_d1c < (int)local_1148; local_d1c = local_d1c + 1) {
            local_ce0[(int)local_d1c] =
                 *(int32_t *)
                  (*(long *)(in_stack_00000008 + 0x10) +
                  (ulong)*(byte *)(in_RDI + (int)local_d1c) * 4);
          }
          for (local_d1c = local_1148; (int)local_d1c < (int)(local_1148 + 7);
              local_d1c = local_d1c + 1) {
            local_ce0[(int)local_d1c] = 0;
          }
        }
        for (local_d20 = 0; (int)local_d20 < (int)in_ECX; local_d20 = local_d20 + 1) {
          ptr[(long)(int)local_d20 + 7] =
               *(int32_t *)
                (*(long *)(in_stack_00000008 + 0x10) + (ulong)*(byte *)(in_RDX + (int)local_d20) * 4
                );
        }
        for (local_d20 = -7; uVar43 = in_ECX, (int)local_d20 < 0; local_d20 = local_d20 + 1) {
          ptr[(long)(int)local_d20 + 7] = 0;
        }
        while (local_d20 = uVar43, (int)local_d20 < (int)(in_ECX + 7)) {
          ptr[(long)(int)local_d20 + 7] = 0;
          uVar43 = local_d20 + 1;
        }
        for (local_d20 = 0; (int)local_d20 < (int)in_ECX; local_d20 = local_d20 + 1) {
          ptr_00[(long)(int)local_d20 + 7] = -(local_d20 * in_R9D) - in_R8D;
          ptr_01[(long)(int)local_d20 + 7] = local_d34;
        }
        for (local_d20 = -7; uVar43 = in_ECX, (int)local_d20 < 0; local_d20 = local_d20 + 1) {
          ptr_00[(long)(int)local_d20 + 7] = local_d34;
          ptr_01[(long)(int)local_d20 + 7] = local_d34;
        }
        while (local_d20 = uVar43, (int)local_d20 < (int)(in_ECX + 7)) {
          ptr_00[(long)(int)local_d20 + 7] = local_d34;
          ptr_01[(long)(int)local_d20 + 7] = local_d34;
          uVar43 = local_d20 + 1;
        }
        ptr_00[6] = 0;
        for (local_d1c = 0; (int)local_d1c < (int)local_1148; local_d1c = local_d1c + 8) {
          local_fc0._16_8_ = uStack_bd0;
          local_fc0._0_16_ = auVar16;
          uStack_fa8 = uStack_bc8;
          local_fe0._16_8_ = uStack_bd0;
          local_fe0._0_16_ = auVar16;
          uStack_fc8 = uStack_bc8;
          local_1000._16_8_ = uStack_bd0;
          local_1000._0_16_ = auVar16;
          local_1000._24_8_ = uStack_bc8;
          local_1020._16_8_ = uStack_bd0;
          local_1020._0_16_ = auVar16;
          uStack_1008 = uStack_bc8;
          local_1040._16_8_ = uStack_910;
          local_1040._0_16_ = auVar23;
          local_1040._24_8_ = uStack_908;
          lVar8 = *(long *)(in_stack_00000008 + 8);
          iVar46 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_118c = local_ce0[(int)local_d1c];
          }
          else {
            if ((int)local_d1c < (int)local_1148) {
              local_1190 = local_d1c;
            }
            else {
              local_1190 = local_1148 - 1;
            }
            local_118c = local_1190;
          }
          lVar9 = *(long *)(in_stack_00000008 + 8);
          iVar3 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_11a4 = local_ce0[(int)(local_d1c + 1)];
          }
          else {
            if ((int)(local_d1c + 1) < (int)local_1148) {
              local_11a8 = local_d1c + 1;
            }
            else {
              local_11a8 = local_1148 - 1;
            }
            local_11a4 = local_11a8;
          }
          lVar10 = *(long *)(in_stack_00000008 + 8);
          iVar4 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_11bc = local_ce0[(int)(local_d1c + 2)];
          }
          else {
            if ((int)(local_d1c + 2) < (int)local_1148) {
              local_11c0 = local_d1c + 2;
            }
            else {
              local_11c0 = local_1148 - 1;
            }
            local_11bc = local_11c0;
          }
          lVar11 = *(long *)(in_stack_00000008 + 8);
          iVar5 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_11d4 = local_ce0[(int)(local_d1c + 3)];
          }
          else {
            if ((int)(local_d1c + 3) < (int)local_1148) {
              local_11d8 = local_d1c + 3;
            }
            else {
              local_11d8 = local_1148 - 1;
            }
            local_11d4 = local_11d8;
          }
          lVar12 = *(long *)(in_stack_00000008 + 8);
          iVar6 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_11ec = local_ce0[(int)(local_d1c + 4)];
          }
          else {
            if ((int)(local_d1c + 4) < (int)local_1148) {
              local_11f0 = local_d1c + 4;
            }
            else {
              local_11f0 = local_1148 - 1;
            }
            local_11ec = local_11f0;
          }
          piVar13 = *(int **)(in_stack_00000008 + 8);
          iVar7 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1204 = local_ce0[(int)(local_d1c + 5)];
          }
          else {
            if ((int)(local_d1c + 5) < (int)local_1148) {
              local_1208 = local_d1c + 5;
            }
            else {
              local_1208 = local_1148 - 1;
            }
            local_1204 = local_1208;
          }
          lVar56 = *(long *)(in_stack_00000008 + 8);
          iVar57 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar55 = local_ce0[(int)(local_d1c + 6)];
          }
          else if ((int)(local_d1c + 6) < (int)local_1148) {
            in_stack_ffffffffffffede0 = local_d1c + 6;
            iVar55 = in_stack_ffffffffffffede0;
          }
          else {
            in_stack_ffffffffffffede0 = local_1148 - 1;
            iVar55 = in_stack_ffffffffffffede0;
          }
          lVar45 = lVar56 + (long)(iVar57 * iVar55) * 4;
          lVar53 = *(long *)(in_stack_00000008 + 8);
          iVar54 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            j_00 = local_ce0[(int)(local_d1c + 7)];
          }
          else if ((int)(local_d1c + 7) < (int)local_1148) {
            in_stack_ffffffffffffedc8 = local_d1c + 7;
            j_00 = in_stack_ffffffffffffedc8;
          }
          else {
            in_stack_ffffffffffffedc8 = local_1148 - 1;
            j_00 = in_stack_ffffffffffffedc8;
          }
          lVar1 = lVar53 + (long)(iVar54 * j_00) * 4;
          auVar49 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff050),0xc);
          auVar47 = vpsrldq_avx2(_local_fc0,4);
          auVar47 = vpor_avx2(auVar49,auVar47);
          iVar2 = ptr_00[6];
          auVar50._4_4_ = iVar2;
          auVar50._0_4_ = iVar2;
          auVar50._8_4_ = iVar2;
          auVar50._12_4_ = iVar2;
          auVar50._16_4_ = iVar2;
          auVar50._20_4_ = iVar2;
          auVar50._24_4_ = iVar2;
          auVar50._28_4_ = iVar2;
          _local_fc0 = vpblendd_avx2(auVar47,auVar50,0x80);
          auVar49 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff030),0xc);
          auVar47 = vpsrldq_avx2(_local_fe0,4);
          auVar47 = vpor_avx2(auVar49,auVar47);
          iVar44 = -(in_R8D + local_d1c * in_R9D);
          auVar51._4_4_ = iVar44;
          auVar51._0_4_ = iVar44;
          auVar51._8_4_ = iVar44;
          auVar51._12_4_ = iVar44;
          auVar51._16_4_ = iVar44;
          auVar51._20_4_ = iVar44;
          auVar51._24_4_ = iVar44;
          auVar51._28_4_ = iVar44;
          _local_fe0 = vpblendd_avx2(auVar47,auVar51,0x80);
          ptr_00[6] = -((local_d1c + 8) * in_R9D) - in_R8D;
          array = piVar13;
          for (local_d20 = 0; auVar47 = _local_fc0, (int)local_d20 < (int)(in_ECX + 7);
              local_d20 = local_d20 + 1) {
            auVar50 = vpslldq_avx2(ZEXT1632(stack0xfffffffffffff030),0xc);
            auVar49 = vpsrldq_avx2(_local_fe0,4);
            auVar49 = vpor_avx2(auVar50,auVar49);
            _local_fc0 = auVar49._0_28_;
            uStack_fa8._4_4_ = ptr_00[(long)(int)local_d20 + 7];
            auVar51 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeff0),0xc);
            auVar50 = vpsrldq_avx2(_local_1020,4);
            auVar50 = vpor_avx2(auVar51,auVar50);
            _local_1020 = auVar50._0_28_;
            uStack_1008._4_4_ = ptr_01[(long)(int)local_d20 + 7];
            auVar34._24_8_ = uStack_fa8;
            auVar34._0_24_ = auVar49._0_24_;
            auVar33._16_8_ = uStack_b90;
            auVar33._0_16_ = auVar17;
            auVar33._24_8_ = uStack_b88;
            auVar49 = vpsubd_avx2(auVar34,auVar33);
            auVar32._24_8_ = uStack_1008;
            auVar32._0_24_ = auVar50._0_24_;
            auVar31._16_8_ = uStack_b50;
            auVar31._0_16_ = auVar18;
            auVar31._24_8_ = uStack_b48;
            auVar50 = vpsubd_avx2(auVar32,auVar31);
            auVar49 = vpmaxsd_avx2(auVar49,auVar50);
            auVar30._16_8_ = uStack_b90;
            auVar30._0_16_ = auVar17;
            auVar30._24_8_ = uStack_b88;
            auVar50 = vpsubd_avx2(_local_fe0,auVar30);
            auVar29._16_8_ = uStack_b50;
            auVar29._0_16_ = auVar18;
            auVar29._24_8_ = uStack_b48;
            auVar51 = vpsubd_avx2(local_1000,auVar29);
            auVar50 = vpmaxsd_avx2(auVar50,auVar51);
            auVar24 = vpinsrd_avx(ZEXT416(*(uint *)(lVar1 + (long)ptr[(long)(int)(local_d20 + -7) +
                                                                      7] * 4)),
                                  *(undefined4 *)
                                   (lVar45 + (long)ptr[(long)(int)(local_d20 + -6) + 7] * 4),1);
            auVar24 = vpinsrd_avx(auVar24,piVar13[(long)(iVar7 * local_1204) +
                                                  (long)ptr[(long)(int)(local_d20 + -5) + 7]],2);
            auVar24 = vpinsrd_avx(auVar24,*(undefined4 *)
                                           (lVar12 + (long)(iVar6 * local_11ec) * 4 +
                                           (long)ptr[(long)(int)(local_d20 + -4) + 7] * 4),3);
            auVar25 = vpinsrd_avx(ZEXT416(*(uint *)(lVar11 + (long)(iVar5 * local_11d4) * 4 +
                                                   (long)ptr[(long)(int)(local_d20 + -3) + 7] * 4)),
                                  *(undefined4 *)
                                   (lVar10 + (long)(iVar4 * local_11bc) * 4 +
                                   (long)ptr[(long)(int)(local_d20 + -2) + 7] * 4),1);
            auVar25 = vpinsrd_avx(auVar25,*(undefined4 *)
                                           (lVar9 + (long)(iVar3 * local_11a4) * 4 +
                                           (long)ptr[(long)(int)(local_d20 + -1) + 7] * 4),2);
            auVar25 = vpinsrd_avx(auVar25,*(undefined4 *)
                                           (lVar8 + (long)(iVar46 * local_118c) * 4 +
                                           (long)ptr[(long)(int)local_d20 + 7] * 4),3);
            uStack_990 = auVar25._0_8_;
            uStack_988 = auVar25._8_8_;
            auVar37._16_8_ = uStack_990;
            auVar37._0_16_ = auVar24;
            auVar37._24_8_ = uStack_988;
            auVar47 = vpaddd_avx2(auVar47,auVar37);
            auVar47 = vpmaxsd_avx2(auVar47,auVar50);
            auVar51 = vpmaxsd_avx2(auVar47,auVar49);
            auVar38._16_8_ = uStack_a50;
            auVar38._0_16_ = auVar22;
            auVar38._24_8_ = uStack_a48;
            auVar47 = vpcmpeqd_avx2(local_1040,auVar38);
            _local_fe0 = vpblendvb_avx2(auVar51,local_fa0,auVar47);
            auVar40._16_8_ = uStack_bd0;
            auVar40._0_16_ = auVar16;
            auVar40._24_8_ = uStack_bc8;
            _local_1020 = vpblendvb_avx2(auVar49,auVar40,auVar47);
            auVar39._16_8_ = uStack_bd0;
            auVar39._0_16_ = auVar16;
            auVar39._24_8_ = uStack_bc8;
            local_1000 = vpblendvb_avx2(auVar50,auVar39,auVar47);
            if (7 < (int)local_d20) {
              local_da0 = vpminsd_avx2(local_da0,_local_fe0);
              local_dc0 = vpmaxsd_avx2(local_dc0,_local_fe0);
            }
            vWH_00[0]._4_4_ = iVar54;
            vWH_00[0]._0_4_ = in_stack_ffffffffffffedd8;
            vWH_00[1]._0_4_ = in_stack_ffffffffffffede0;
            vWH_00[1]._4_4_ = iVar55;
            vWH_00[2] = lVar56;
            vWH_00[3]._0_4_ = in_stack_ffffffffffffedf0;
            vWH_00[3]._4_4_ = iVar57;
            arr_store_si256(array,vWH_00,(int32_t)((ulong)lVar53 >> 0x20),(int32_t)lVar53,j_00,
                            in_stack_ffffffffffffedc8);
            ptr_00[(long)(int)(local_d20 + -7) + 7] = local_fe0._0_4_;
            ptr_01[(long)(int)(local_d20 + -7) + 7] = local_1020._0_4_;
            auVar47 = vpcmpeqd_avx2(local_ec0,auVar26);
            auVar49 = vpcmpeqd_avx2(local_1040,auVar27);
            auVar47 = vpand_avx2(auVar47,auVar49);
            local_f00 = vpblendvb_avx2(local_f00,_local_fe0,auVar47);
            auVar36._16_8_ = uStack_b10;
            auVar36._0_16_ = auVar19;
            auVar36._24_8_ = uStack_b08;
            local_1040 = vpaddd_avx2(local_1040,auVar36);
          }
          auVar35._16_8_ = uStack_ad0;
          auVar35._0_16_ = auVar20;
          auVar35._24_8_ = uStack_ac8;
          local_ec0 = vpaddd_avx2(local_ec0,auVar35);
          auVar28._16_8_ = uStack_a90;
          auVar28._0_16_ = auVar21;
          auVar28._24_8_ = uStack_a88;
          auVar52 = ZEXT3264(auVar28);
          local_fa0 = vpsubd_avx2(local_fa0,auVar28);
        }
        for (local_d1c = 0; (int)local_d1c < 8; local_d1c = local_d1c + 1) {
          if ((int)local_d34 < (int)local_f00._28_4_) {
            local_d34 = local_f00._28_4_;
          }
          auVar26 = vperm2i128_avx2(auVar52._0_32_,local_f00,0x28);
          auVar52 = ZEXT3264(auVar26);
          local_f00 = vpalignr_avx2(local_f00,auVar26,0xc);
        }
        auVar42._16_8_ = uStack_c50;
        auVar42._0_16_ = auVar14;
        auVar42._24_8_ = uStack_c48;
        auVar26 = vpcmpgtd_avx2(auVar42,local_da0);
        auVar41._16_8_ = uStack_c10;
        auVar41._0_16_ = auVar15;
        auVar41._24_8_ = uStack_c08;
        auVar27 = vpcmpgtd_avx2(local_dc0,auVar41);
        auVar26 = vpor_avx2(auVar26,auVar27);
        if ((((((((((((((((((((((((((((((((auVar26 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar26 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar26 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar26 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar26 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar26 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar26 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar26 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar26 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar26 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar26 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar26 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar26 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar26 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar26 >> 0x7f,0) != '\0') ||
                          (auVar26 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar26 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar26 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar26 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar26 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar26 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar26 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar26 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar26[0x1f] < '\0') {
          local_c98->flag = local_c98->flag | 0x40;
          local_d34 = 0;
          local_d24 = 0;
          local_d28 = 0;
        }
        local_c98->score = local_d34;
        local_c98->end_query = local_d24;
        local_c98->end_ref = local_d28;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_ce0);
        }
      }
    }
  }
  return local_c98;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi32(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm256_extract_epi32_rpl(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 4);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}